

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EventControlSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventControlSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1)

{
  Token at;
  EventControlSyntax *this_00;
  
  this_00 = (EventControlSyntax *)allocate(this,0x28,8);
  at.kind = args->kind;
  at._2_1_ = args->field_0x2;
  at.numFlags.raw = (args->numFlags).raw;
  at.rawLen = args->rawLen;
  at.info = args->info;
  slang::syntax::EventControlSyntax::EventControlSyntax(this_00,at,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }